

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::is_hidden_variable(Compiler *this,SPIRVariable *var,bool include_builtins)

{
  bool bVar1;
  CombinedImageSampler *pCVar2;
  CombinedImageSampler *pCVar3;
  _Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true> local_50;
  key_type local_44;
  _Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true> local_40;
  byte local_31;
  SPIRVariable *pSStack_30;
  bool hidden;
  byte local_21;
  anon_class_8_1_ba1d8287_for__M_pred aStack_20;
  bool include_builtins_local;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  local_21 = include_builtins;
  aStack_20.var = var;
  var_local = (SPIRVariable *)this;
  bVar1 = is_builtin_variable(this,var);
  if (((bVar1) && ((local_21 & 1) == 0)) || (((aStack_20.var)->remapped_variable & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    pCVar2 = ::std::begin<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    pCVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    pSStack_30 = aStack_20.var;
    pCVar2 = ::std::
             find_if<spirv_cross::CombinedImageSampler_const*,spirv_cross::Compiler::is_hidden_variable(spirv_cross::SPIRVariable_const&,bool)const::__0>
                       (pCVar2,pCVar3,aStack_20);
    pCVar3 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    if (pCVar2 == pCVar3) {
      local_31 = 0;
      if (((this->check_active_interface_variables & 1U) != 0) &&
         (bVar1 = storage_class_is_interface((aStack_20.var)->storage), bVar1)) {
        local_44.id = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&((aStack_20.var)->super_IVariant).self);
        local_40._M_cur =
             (__node_type *)
             ::std::
             unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
             ::find(&this->active_interface_variables,&local_44);
        local_50._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>>,std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>>>>
                       (&this->active_interface_variables);
        local_31 = ::std::__detail::operator==(&local_40,&local_50);
      }
      this_local._7_1_ = (bool)(local_31 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	bool hidden = false;
	if (check_active_interface_variables && storage_class_is_interface(var.storage))
		hidden = active_interface_variables.find(var.self) == end(active_interface_variables);
	return hidden;
}